

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

int __thiscall
array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_>::remove
          (array<CSkins::CSkin,_allocator_default<CSkins::CSkin>_> *this,char *__filename)

{
  int iVar1;
  undefined8 extraout_RAX;
  long lVar2;
  long lVar3;
  
  if (this->num_elements < 1) {
    return 0;
  }
  lVar2 = 0;
  lVar3 = 0;
  do {
    iVar1 = mem_comp(this->list->m_aName + lVar2 + -4,__filename,200);
    if (iVar1 == 0) {
      remove_index(this,(int)lVar3);
      return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    }
    lVar3 = lVar3 + 1;
    lVar2 = lVar2 + 200;
  } while (lVar3 < this->num_elements);
  return 0;
}

Assistant:

bool remove(const T& item)
	{
		for(int i = 0; i < size(); i++)
			if(list[i] == item)
			{
				remove_index(i);
				return true;
			}
		return false;
	}